

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void YCSB_F(size_t number,K *random_keys,TestIndex *test_index)

{
  double key;
  ostream *poVar1;
  void *pvVar2;
  Zipfian *this;
  size_t sVar3;
  result_type rVar4;
  void *pvVar5;
  result_type_conflict rVar6;
  size_t i;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar11 [16];
  undefined8 in_XMM3_Qb;
  timeval t1;
  uniform_int_distribution<unsigned_long> dist_temp;
  timeval t2;
  uniform_int_distribution<long> payload_dist;
  mt19937 gen_temp;
  mt19937 payload_gen;
  timeval local_2780;
  uniform_int_distribution<unsigned_long> local_2770;
  timeval local_2760;
  uniform_int_distribution<long> local_2750;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Preparing workloads...");
  std::endl<char,std::char_traits<char>>(poVar1);
  pvVar2 = operator_new__(800000000);
  this = (Zipfian *)operator_new(0x13c8);
  Zipfian::Zipfian(this,number);
  for (lVar7 = 0; lVar7 != 100000000; lVar7 = lVar7 + 1) {
    sVar3 = Zipfian::next(this);
    *(K *)((long)pvVar2 + lVar7 * 8) = random_keys[sVar3];
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<double,_std::pair<const_double,_unsigned_long>,_std::_Select1st<std::pair<const_double,_unsigned_long>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               *)this);
  operator_delete(this,0x13c8);
  local_2750._M_param._M_a = -1000000000;
  local_2750._M_param._M_b = 1000000000;
  rVar4 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,rVar4);
  pvVar5 = operator_new__(800000000);
  for (lVar7 = 0; lVar7 != 100000000; lVar7 = lVar7 + 1) {
    rVar6 = std::uniform_int_distribution<long>::operator()(&local_2750,&local_13b8);
    *(result_type_conflict *)((long)pvVar5 + lVar7 * 8) = rVar6;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Warming up...");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_2770._M_param._M_b = number - 1;
  local_2770._M_param._M_a = 0;
  rVar4 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2740,rVar4);
  lVar7 = 100000000;
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&local_2770,&local_2740);
    BufferIndex<double,_long>::find(test_index,random_keys[rVar4]);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Start doing YCSB-F benchmark...");
  std::endl<char,std::char_traits<char>>(poVar1);
  gettimeofday(&local_2780,(__timezone_ptr_t)0x0);
  for (lVar7 = 0; lVar7 != 100000000; lVar7 = lVar7 + 1) {
    key = *(double *)((long)pvVar2 + lVar7 * 8);
    BufferIndex<double,_long>::find(test_index,key);
    BufferIndex<double,_long>::upsert(test_index,key,*(long *)((long)pvVar5 + lVar7 * 8));
  }
  gettimeofday(&local_2760,(__timezone_ptr_t)0x0);
  std::operator<<((ostream *)&std::cout,"Total time: ");
  auVar9._0_8_ = (double)local_2760.tv_sec;
  auVar9._8_8_ = in_XMM1_Qb;
  auVar11._0_8_ = (double)local_2760.tv_usec;
  auVar11._8_8_ = in_XMM1_Qb;
  auVar9 = vfmadd231sd_fma(auVar11,ZEXT816(0x412e848000000000),auVar9);
  auVar10._0_8_ = (double)local_2780.tv_sec;
  auVar10._8_8_ = in_XMM3_Qb;
  auVar9 = vfnmadd213sd_fma(auVar10,ZEXT816(0x412e848000000000),auVar9);
  poVar1 = std::ostream::_M_insert<double>((auVar9._0_8_ - (double)local_2780.tv_usec) / 1000.0);
  poVar1 = std::operator<<(poVar1," ms");
  std::endl<char,std::char_traits<char>>(poVar1);
  operator_delete__(pvVar2);
  operator_delete__(pvVar5);
  poVar1 = std::operator<<((ostream *)&std::cout,"YCSB-F benchmark complete!");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void YCSB_F(const size_t number, const K* random_keys, TestIndex& test_index) {
    size_t transactions = 2e8;
    size_t times = transactions >> 1;

    std::cout<<"Preparing workloads..."<<std::endl;
    K* search_keys = new K[times];
    auto* zipfian = new Zipfian(number);
    for (size_t i = 0; i < times; i++) {
        search_keys[i] = random_keys[zipfian->next()];
    }
    delete zipfian;
    std::uniform_int_distribution<P> payload_dist(-1e9,1e9);
    std::mt19937 payload_gen(time(NULL));
    P* new_payloads = new P[times];
    for (size_t i = 0; i < times; i++) {
        new_payloads[i] = payload_dist(payload_gen);
    }
    timeval t1, t2;
    P* search_answers = new P[times];

    std::cout<<"Warming up..."<<std::endl;
    std::uniform_int_distribution<size_t> dist_temp(0, number - 1);
    std::mt19937 gen_temp(time(NULL));
    for (size_t i = 0; i < 1e8; i++) {
        test_index.find(random_keys[dist_temp(gen_temp)]);
    }

    std::cout<<"Start doing YCSB-F benchmark..."<<std::endl;
    gettimeofday(&t1, NULL);
    for(size_t i = 0; i < times; i++){
        search_answers[i] = test_index.find(search_keys[i]);
        test_index.upsert(search_keys[i], new_payloads[i]);
    }
    gettimeofday(&t2, NULL);
    std::cout<<"Total time: "<<(t2.tv_sec*1e6+t2.tv_usec-t1.tv_sec*1e6-t1.tv_usec)/1000<<" ms"<<std::endl;
    delete [] search_keys;
    delete [] search_answers;
    delete [] new_payloads;
    std::cout<<"YCSB-F benchmark complete!"<<std::endl;
}